

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_4::Validator::Validator
          (Validator *this,Errors *errors,Module *module,ValidateOptions *options)

{
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR__Validator_00188398;
  this->options_ = options;
  this->errors_ = errors;
  SharedValidator::SharedValidator(&this->validator_,errors,options);
  this->current_module_ = module;
  (this->result_).enum_ = Ok;
  return;
}

Assistant:

Validator::Validator(Errors* errors,
                     const Module* module,
                     const ValidateOptions& options)
    : options_(options),
      errors_(errors),
      validator_(errors_, options_),
      current_module_(module) {}